

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_log10>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [24];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined4 uVar44;
  long *in_RDI;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar45 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log10 op;
  Mat *m;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf y_1;
  v4sf z_1;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_1;
  v4si emm0;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  int local_181c;
  undefined8 local_1818;
  undefined8 local_1810;
  undefined8 local_1808;
  undefined4 local_1800;
  long local_17f8;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined4 local_17e0;
  undefined8 local_17d8;
  undefined1 (*local_17d0) [32];
  int local_17c8;
  int local_17c4;
  int local_17c0;
  int local_17bc;
  int local_17b8;
  int local_17b4;
  int local_17b0;
  undefined1 local_17a9 [9];
  long *local_17a0;
  undefined1 local_1795;
  int local_1794;
  undefined8 *local_1788;
  undefined8 *local_1780;
  undefined8 *local_1770;
  undefined1 (*local_1768) [32];
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined1 (*local_1730) [32];
  undefined1 (*local_1728) [32];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined1 (*local_1710) [32];
  long local_1708;
  undefined4 local_16fc;
  long local_16f8;
  undefined1 (*local_16f0) [32];
  undefined4 local_16e4;
  int local_16e0;
  int local_16dc;
  undefined8 *local_16d8;
  undefined4 local_16cc;
  long local_16c8;
  undefined8 *local_16b8;
  undefined8 *local_1690;
  undefined1 *local_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined1 local_1660 [8];
  float fStack_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  undefined4 uStack_1644;
  undefined1 local_1640 [8];
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [8];
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined1 local_15a0 [32];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [8];
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined1 local_1460 [32];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 *local_12b8;
  float *local_12b0;
  undefined1 *local_12a8;
  float local_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined1 *local_1258;
  float *local_1250;
  undefined1 *local_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  float *local_11f8;
  undefined1 *local_11f0;
  undefined1 *local_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  float *local_1198;
  undefined1 *local_1190;
  undefined1 *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float *local_1078;
  undefined1 *local_1070;
  undefined1 *local_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float *local_1018;
  undefined1 *local_1010;
  undefined1 *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float *local_fb8;
  undefined1 *local_fb0;
  undefined1 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float *local_f58;
  undefined1 *local_f50;
  undefined1 *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined1 *local_ef8;
  float *local_ef0;
  float *local_ee8;
  float local_ee0;
  float fStack_edc;
  float fStack_ed8;
  float fStack_ed4;
  float fStack_ed0;
  float fStack_ecc;
  float fStack_ec8;
  float fStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0 [2];
  float afStack_e98 [2];
  float afStack_e90 [2];
  float afStack_e88 [2];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  float local_e20 [2];
  float afStack_e18 [2];
  float afStack_e10 [2];
  float afStack_e08 [2];
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  float local_de0 [2];
  float afStack_dd8 [2];
  float afStack_dd0 [2];
  float afStack_dc8 [2];
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  float local_da0 [2];
  float afStack_d98 [2];
  float afStack_d90 [2];
  float afStack_d88 [2];
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  float fStack_d64;
  float local_d60 [2];
  float afStack_d58 [2];
  float afStack_d50 [2];
  float afStack_d48 [2];
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_ce0 [2];
  float afStack_cd8 [2];
  float afStack_cd0 [2];
  float afStack_cc8 [2];
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_ca0 [2];
  float afStack_c98 [2];
  float afStack_c90 [2];
  float afStack_c88 [2];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  undefined4 uStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  undefined4 local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined4 local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined4 local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined4 local_804;
  undefined1 local_800 [32];
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined4 local_7c4;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined8 *local_7b0;
  undefined1 *local_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined1 local_790 [8];
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 local_730 [16];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined1 local_710 [16];
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined1 local_690 [16];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined1 local_650 [16];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined1 *local_548;
  float *local_540;
  float *local_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_510 [2];
  float afStack_508 [2];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined1 *local_4e8;
  float *local_4e0;
  undefined1 *local_4d8;
  float local_4d0 [2];
  float afStack_4c8 [2];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined1 *local_488;
  float *local_480;
  undefined1 *local_478;
  float local_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  float local_3f0 [2];
  float afStack_3e8 [2];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390 [2];
  float afStack_388 [2];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330 [2];
  float afStack_328 [2];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0 [2];
  float afStack_2c8 [2];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270 [2];
  float afStack_268 [2];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_210 [2];
  float afStack_208 [2];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1b0 [2];
  float afStack_1a8 [2];
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150 [2];
  float afStack_148 [2];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  ulong uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_44;
  undefined1 (*local_40) [32];
  undefined1 *local_38;
  
  local_17b0 = *(int *)((long)in_RDI + 0x2c);
  local_17b4 = (int)in_RDI[6];
  local_17b8 = *(int *)((long)in_RDI + 0x34);
  local_17bc = (int)in_RDI[7];
  local_17c0 = (int)in_RDI[3];
  local_17c4 = local_17b0 * local_17b4 * local_17b8 * local_17c0;
  local_17a0 = in_RDI;
  for (local_17c8 = 0; local_17c8 < local_17bc; local_17c8 = local_17c8 + 1) {
    local_1788 = &local_1818;
    local_16dc = *(int *)((long)local_17a0 + 0x2c);
    local_16e0 = (int)local_17a0[6];
    local_16e4 = *(undefined4 *)((long)local_17a0 + 0x34);
    local_16f0 = (undefined1 (*) [32])
                 (*local_17a0 + local_17a0[8] * (long)local_17c8 * local_17a0[2]);
    local_16f8 = local_17a0[2];
    local_16fc = (undefined4)local_17a0[3];
    local_1708 = local_17a0[4];
    local_16d8 = &local_1818;
    local_16c8 = (long)local_16dc * (long)local_16e0 * local_16f8;
    local_1780 = &local_1818;
    local_1770 = &local_1818;
    local_16cc = 0x10;
    local_1794 = local_17c8;
    local_1795 = 1;
    local_1818 = 0;
    local_1808 = 0;
    local_1800 = 0;
    local_17f0 = 0;
    local_17ec = 0;
    local_17e8 = 0;
    local_17e4 = 0;
    local_17e0 = 0;
    local_17d8 = 0;
    local_1810 = 0;
    uVar6 = uStack_1828;
    local_17d0 = local_16f0;
    for (local_181c = 0; uStack_1828 = uVar6, uVar44 = uStack_1828._4_4_, fVar48 = uStack_1830._4_4_
        , fVar47 = uStack_1838._4_4_, fVar46 = local_1840._4_4_, local_181c + 7 < local_17c4;
        local_181c = local_181c + 8) {
      local_1768 = local_17d0;
      uStack_12c8 = *(undefined8 *)(*local_17d0 + 0x18);
      uStack_1838._4_4_ = (float)((ulong)*(undefined8 *)(*local_17d0 + 8) >> 0x20);
      uStack_1830._0_4_ = (undefined4)*(undefined8 *)(*local_17d0 + 0x10);
      uStack_1830._4_4_ = (float)((ulong)*(undefined8 *)(*local_17d0 + 0x10) >> 0x20);
      uStack_1828._0_4_ = (undefined4)uStack_12c8;
      uStack_1828._4_4_ = (undefined4)((ulong)uStack_12c8 >> 0x20);
      local_1688 = local_17a9;
      local_1690 = &local_1840;
      auVar5._12_4_ = uStack_1838._4_4_;
      auVar5._0_12_ = *(undefined1 (*) [12])*local_17d0;
      auVar40._16_4_ = (undefined4)uStack_1830;
      auVar40._0_16_ = auVar5;
      auVar40._20_4_ = uStack_1830._4_4_;
      auVar42._12_4_ = uStack_1838._4_4_;
      auVar42._0_12_ = *(undefined1 (*) [12])*local_17d0;
      auVar42._16_4_ = (undefined4)uStack_1830;
      auVar42._20_4_ = uStack_1830._4_4_;
      auVar42._24_4_ = (undefined4)uStack_1828;
      auVar42._28_4_ = uStack_1828._4_4_;
      auVar41._12_4_ = uStack_1838._4_4_;
      auVar41._0_12_ = *(undefined1 (*) [12])*local_17d0;
      auVar41._16_4_ = (undefined4)uStack_1830;
      auVar41._20_4_ = uStack_1830._4_4_;
      auVar41._24_4_ = (undefined4)uStack_1828;
      auVar41._28_4_ = uStack_1828._4_4_;
      local_1580 = 0x3f8000003f800000;
      uStack_1578 = 0x3f8000003f800000;
      uStack_1570 = 0x3f8000003f800000;
      uStack_1568 = 0x3f8000003f800000;
      local_13e0 = 0;
      uStack_13d8 = 0;
      uStack_13d0 = 0;
      uStack_13c8 = 0;
      local_15a0 = vcmpps_avx(auVar41,ZEXT1632(ZEXT816(0)),2);
      local_1540 = SUB128(*(undefined1 (*) [12])*local_17d0,0);
      local_12e0 = local_1540;
      uStack_1538 = auVar5._8_8_;
      uStack_12d8 = uStack_1538;
      uStack_1530 = auVar40._16_8_;
      uStack_12d0 = uStack_1530;
      local_1300 = 0x80000000800000;
      uStack_12f8 = 0x80000000800000;
      uStack_12f0 = 0x80000000800000;
      uStack_12e8 = 0x80000000800000;
      auVar23._8_8_ = 0x80000000800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._16_8_ = 0x80000000800000;
      auVar23._24_8_ = 0x80000000800000;
      auVar3 = vmaxps_avx(auVar42,auVar23);
      local_1540 = auVar3._0_8_;
      local_a60 = local_1540;
      uStack_1538 = auVar3._8_8_;
      uStack_a58 = uStack_1538;
      uStack_1530 = auVar3._16_8_;
      uStack_a50 = uStack_1530;
      uStack_1528 = auVar3._24_8_;
      uStack_a48 = uStack_1528;
      local_a80 = local_1540;
      uStack_a78 = uStack_1538;
      uStack_a70 = uStack_1530;
      uStack_a68 = uStack_1528;
      local_a84 = 0x17;
      local_b00 = local_1540;
      uStack_af8 = uStack_1538;
      uStack_af0 = uStack_1530;
      uStack_ae8 = uStack_1528;
      local_860 = local_1540;
      uStack_858 = uStack_1538;
      local_864 = 0x17;
      local_aa0 = vpsrld_avx(auVar3._0_16_,ZEXT416(0x17));
      local_880 = uStack_1530;
      uStack_878 = uStack_1528;
      local_884 = 0x17;
      local_ab0 = vpsrld_avx(auVar3._16_16_,ZEXT416(0x17));
      local_b20 = local_aa0._0_8_;
      uStack_b18 = local_aa0._8_8_;
      uStack_b10 = local_ab0._0_8_;
      uStack_b08 = local_ab0._8_8_;
      local_ae0 = local_aa0._0_8_;
      uStack_ad8 = local_aa0._8_8_;
      uStack_ad0 = local_ab0._0_8_;
      uStack_ac8 = local_ab0._8_8_;
      local_1480 = local_1540;
      uStack_1478 = uStack_1538;
      uStack_1470 = uStack_1530;
      uStack_1468 = uStack_1528;
      local_14a0 = 0x807fffff807fffff;
      uStack_1498 = 0x807fffff807fffff;
      uStack_1490 = 0x807fffff807fffff;
      uStack_1488 = 0x807fffff807fffff;
      auVar20._8_8_ = 0x807fffff807fffff;
      auVar20._0_8_ = 0x807fffff807fffff;
      auVar20._16_8_ = 0x807fffff807fffff;
      auVar20._24_8_ = 0x807fffff807fffff;
      auVar3 = vandps_avx(auVar3,auVar20);
      local_1540 = auVar3._0_8_;
      local_9e0 = local_1540;
      uStack_1538 = auVar3._8_8_;
      uStack_9d8 = uStack_1538;
      uStack_1530 = auVar3._16_8_;
      uStack_9d0 = uStack_1530;
      uStack_1528 = auVar3._24_8_;
      uStack_9c8 = uStack_1528;
      local_a00 = 0x3f0000003f000000;
      uStack_9f8 = 0x3f0000003f000000;
      uStack_9f0 = 0x3f0000003f000000;
      uStack_9e8 = 0x3f0000003f000000;
      auVar26._8_8_ = 0x3f0000003f000000;
      auVar26._0_8_ = 0x3f0000003f000000;
      auVar26._16_8_ = 0x3f0000003f000000;
      auVar26._24_8_ = 0x3f0000003f000000;
      auVar4 = vorps_avx(auVar3,auVar26);
      local_8e0 = local_aa0._0_8_;
      uStack_8d8 = local_aa0._8_8_;
      uStack_8d0 = local_ab0._0_8_;
      uStack_8c8 = local_ab0._8_8_;
      local_900 = 0x7f0000007f;
      uStack_8f8 = 0x7f0000007f;
      uStack_8f0 = 0x7f0000007f;
      uStack_8e8 = 0x7f0000007f;
      local_980 = local_aa0._0_8_;
      uStack_978 = local_aa0._8_8_;
      uStack_970 = local_ab0._0_8_;
      uStack_968 = local_ab0._8_8_;
      local_9a0 = 0x7f0000007f;
      uStack_998 = 0x7f0000007f;
      uStack_990 = 0x7f0000007f;
      uStack_988 = 0x7f0000007f;
      local_930 = 0x7f0000007f;
      uStack_928 = 0x7f0000007f;
      local_940 = 0x7f0000007f;
      uStack_938 = 0x7f0000007f;
      local_820 = local_aa0._0_8_;
      uStack_818 = local_aa0._8_8_;
      local_830 = 0x7f0000007f;
      uStack_828 = 0x7f0000007f;
      auVar2._8_8_ = 0x7f0000007f;
      auVar2._0_8_ = 0x7f0000007f;
      local_910 = vpsubd_avx(local_aa0,auVar2);
      local_840 = local_ab0._0_8_;
      uStack_838 = local_ab0._8_8_;
      local_850 = 0x7f0000007f;
      uStack_848 = 0x7f0000007f;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_920 = vpsubd_avx(local_ab0,auVar1);
      local_9c0 = local_910._0_8_;
      uStack_9b8 = local_910._8_8_;
      uStack_9b0 = local_920._0_8_;
      uStack_9a8 = local_920._8_8_;
      local_960 = local_910._0_8_;
      uStack_958 = local_910._8_8_;
      uStack_950 = local_920._0_8_;
      uStack_948 = local_920._8_8_;
      local_1560 = local_910._0_8_;
      uStack_1558 = local_910._8_8_;
      uStack_1550 = local_920._0_8_;
      uStack_1548 = local_920._8_8_;
      local_8c0 = local_910._0_8_;
      uStack_8b8 = local_910._8_8_;
      uStack_8b0 = local_920._0_8_;
      uStack_8a8 = local_920._8_8_;
      auVar27._16_8_ = local_920._0_8_;
      auVar27._0_16_ = local_910;
      auVar27._24_8_ = local_920._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar27);
      local_15c0 = auVar3._0_8_;
      uVar7 = local_15c0;
      uStack_15b8 = auVar3._8_8_;
      uVar8 = uStack_15b8;
      uStack_15b0 = auVar3._16_8_;
      uVar9 = uStack_15b0;
      uStack_15a8 = auVar3._24_8_;
      uVar10 = uStack_15a8;
      local_b60 = 0x3f8000003f800000;
      uStack_b58 = 0x3f8000003f800000;
      uStack_b50 = 0x3f8000003f800000;
      uStack_b48 = 0x3f8000003f800000;
      local_b40._0_4_ = auVar3._0_4_;
      local_b40._4_4_ = auVar3._4_4_;
      uStack_b38._0_4_ = auVar3._8_4_;
      uStack_b38._4_4_ = auVar3._12_4_;
      uStack_b30._0_4_ = auVar3._16_4_;
      uStack_b30._4_4_ = auVar3._20_4_;
      uStack_b28._0_4_ = auVar3._24_4_;
      uStack_b28._4_4_ = auVar3._28_4_;
      local_15c0._4_4_ = local_b40._4_4_ + 1.0;
      local_15c0._0_4_ = (float)local_b40 + 1.0;
      uStack_15b8._0_4_ = (float)uStack_b38 + 1.0;
      uStack_15b8._4_4_ = uStack_b38._4_4_ + 1.0;
      uStack_15b0._0_4_ = (float)uStack_b30 + 1.0;
      uStack_15b0._4_4_ = uStack_b30._4_4_ + 1.0;
      auVar40 = _local_15c0;
      uStack_15a8._0_4_ = (float)uStack_b28 + 1.0;
      uStack_15a8._4_4_ = uStack_b28._4_4_ + 1.0;
      auVar20 = _local_15c0;
      local_15e0 = vcmpps_avx(auVar4,_DAT_01f8f6e0,1);
      local_1540 = auVar4._0_8_;
      local_14c0 = local_1540;
      uStack_1538 = auVar4._8_8_;
      uStack_14b8 = uStack_1538;
      uStack_1530 = auVar4._16_8_;
      uStack_14b0 = uStack_1530;
      uStack_1528 = auVar4._24_8_;
      uStack_14a8 = uStack_1528;
      local_14e0 = local_15e0._0_8_;
      uStack_14d8 = local_15e0._8_8_;
      uStack_14d0 = local_15e0._16_8_;
      uStack_14c8 = local_15e0._24_8_;
      local_1600 = vandps_avx(auVar4,local_15e0);
      local_1400 = local_1540;
      uStack_13f8 = uStack_1538;
      uStack_13f0 = uStack_1530;
      uStack_13e8 = uStack_1528;
      local_1420 = 0x3f8000003f800000;
      uStack_1418 = 0x3f8000003f800000;
      uStack_1410 = 0x3f8000003f800000;
      uStack_1408 = 0x3f8000003f800000;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._16_8_ = 0x3f8000003f800000;
      auVar22._24_8_ = 0x3f8000003f800000;
      auVar3 = vsubps_avx(auVar4,auVar22);
      local_1440 = local_15c0;
      uStack_1438 = uStack_15b8;
      uStack_15b0 = auVar40._16_8_;
      uStack_1430 = uStack_15b0;
      uStack_15a8 = auVar20._24_8_;
      uStack_1428 = uStack_15a8;
      local_1500 = 0x3f8000003f800000;
      uStack_14f8 = 0x3f8000003f800000;
      uStack_14f0 = 0x3f8000003f800000;
      uStack_14e8 = 0x3f8000003f800000;
      local_1520 = local_15e0._0_8_;
      uStack_1518 = local_15e0._8_8_;
      uStack_1510 = local_15e0._16_8_;
      uStack_1508 = local_15e0._24_8_;
      auVar4._8_8_ = 0x3f8000003f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar4._16_8_ = 0x3f8000003f800000;
      auVar4._24_8_ = 0x3f8000003f800000;
      local_1460 = vandps_avx(auVar4,local_15e0);
      auVar21._16_8_ = uStack_15b0;
      auVar21._0_16_ = _local_15c0;
      auVar21._24_8_ = uStack_15a8;
      _local_15c0 = vsubps_avx(auVar21,local_1460);
      local_1540 = auVar3._0_8_;
      uVar11 = local_1540;
      uStack_1538 = auVar3._8_8_;
      uVar12 = uStack_1538;
      uStack_1530 = auVar3._16_8_;
      uVar13 = uStack_1530;
      uStack_1528 = auVar3._24_8_;
      uVar14 = uStack_1528;
      local_b80._0_4_ = auVar3._0_4_;
      local_b80._4_4_ = auVar3._4_4_;
      uStack_b78._0_4_ = auVar3._8_4_;
      uStack_b78._4_4_ = auVar3._12_4_;
      uStack_b70._0_4_ = auVar3._16_4_;
      uStack_b70._4_4_ = auVar3._20_4_;
      uStack_b68._0_4_ = auVar3._24_4_;
      uStack_b68._4_4_ = auVar3._28_4_;
      local_ba0._0_4_ = local_1600._0_4_;
      local_ba0._4_4_ = local_1600._4_4_;
      uStack_b98._0_4_ = local_1600._8_4_;
      uStack_b98._4_4_ = local_1600._12_4_;
      uStack_b90._0_4_ = local_1600._16_4_;
      uStack_b90._4_4_ = local_1600._20_4_;
      uStack_b88._0_4_ = local_1600._24_4_;
      uStack_b88._4_4_ = local_1600._28_4_;
      local_b80._0_4_ = (float)local_b80 + (float)local_ba0;
      local_b80._4_4_ = local_b80._4_4_ + local_ba0._4_4_;
      uStack_b78._0_4_ = (float)uStack_b78 + (float)uStack_b98;
      uStack_b78._4_4_ = uStack_b78._4_4_ + uStack_b98._4_4_;
      uStack_b70._0_4_ = (float)uStack_b70 + (float)uStack_b90;
      uStack_b70._4_4_ = uStack_b70._4_4_ + uStack_b90._4_4_;
      uStack_b68._0_4_ = (float)uStack_b68 + (float)uStack_b88;
      fStack_1604 = uStack_b68._4_4_ + uStack_b88._4_4_;
      local_1540._4_4_ = local_b80._4_4_;
      local_1540._0_4_ = (float)local_b80;
      uStack_1538._0_4_ = (float)uStack_b78;
      uStack_1538._4_4_ = uStack_b78._4_4_;
      uStack_1530._0_4_ = (float)uStack_b70;
      uStack_1530._4_4_ = uStack_b70._4_4_;
      auVar40 = _local_1540;
      uStack_1528._0_4_ = (float)uStack_b68;
      uStack_1528._4_4_ = fStack_1604;
      auVar3 = _local_1540;
      local_1340 = local_1540;
      uStack_1338 = uStack_1538;
      uStack_1530 = auVar40._16_8_;
      uStack_1330 = uStack_1530;
      uStack_1528 = auVar3._24_8_;
      uStack_1328 = uStack_1528;
      local_1620 = (float)local_b80 * (float)local_b80;
      fStack_161c = local_b80._4_4_ * local_b80._4_4_;
      fStack_1618 = (float)uStack_b78 * (float)uStack_b78;
      fStack_1614 = uStack_b78._4_4_ * uStack_b78._4_4_;
      fStack_1610 = (float)uStack_b70 * (float)uStack_b70;
      fStack_160c = uStack_b70._4_4_ * uStack_b70._4_4_;
      fStack_1608 = (float)uStack_b68 * (float)uStack_b68;
      local_1258 = local_1640;
      local_12b8 = local_1540;
      local_f58 = ::_ps256_cephes_log_p1;
      local_f20 = 0x3d9021bb3d9021bb;
      uStack_f18 = 0x3d9021bb3d9021bb;
      uStack_f10 = 0x3d9021bb3d9021bb;
      uStack_f08 = 0x3d9021bb3d9021bb;
      local_f40 = local_1540;
      uStack_f38 = uStack_1538;
      uStack_f30 = uStack_1530;
      uStack_f28 = uStack_1528;
      local_e40 = (float)local_b80 * 0.070376836;
      fStack_e3c = local_b80._4_4_ * 0.070376836;
      fStack_e38 = (float)uStack_b78 * 0.070376836;
      fStack_e34 = uStack_b78._4_4_ * 0.070376836;
      fStack_e30 = (float)uStack_b70 * 0.070376836;
      fStack_e2c = uStack_b70._4_4_ * 0.070376836;
      fStack_e28 = (float)uStack_b68 * 0.070376836;
      local_e60[0] = -0.1151461;
      local_e60[1] = -0.1151461;
      afStack_e58[0] = -0.1151461;
      afStack_e58[1] = -0.1151461;
      afStack_e50[0] = -0.1151461;
      afStack_e50[1] = -0.1151461;
      afStack_e48[0] = -0.1151461;
      afStack_e48[1] = -0.1151461;
      local_1640._4_4_ = fStack_e3c + -0.1151461;
      local_1640._0_4_ = local_e40 + -0.1151461;
      uStack_1638._0_4_ = fStack_e38 + -0.1151461;
      uStack_1638._4_4_ = fStack_e34 + -0.1151461;
      uStack_1630._0_4_ = fStack_e30 + -0.1151461;
      uStack_1630._4_4_ = fStack_e2c + -0.1151461;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_e28 + -0.1151461;
      uStack_1628._4_4_ = fStack_1604 + -0.1151461;
      auVar3 = _local_1640;
      local_fb8 = ::_ps256_cephes_log_p2;
      local_f80 = local_1640;
      uStack_f78 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_f70 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_f68 = uStack_1628;
      local_fa0 = local_1540;
      uStack_f98 = uStack_1538;
      uStack_f90 = uStack_1530;
      uStack_f88 = uStack_1528;
      local_e00 = (local_e40 + -0.1151461) * (float)local_b80;
      fStack_dfc = (fStack_e3c + -0.1151461) * local_b80._4_4_;
      fStack_df8 = (fStack_e38 + -0.1151461) * (float)uStack_b78;
      fStack_df4 = (fStack_e34 + -0.1151461) * uStack_b78._4_4_;
      fStack_df0 = (fStack_e30 + -0.1151461) * (float)uStack_b70;
      fStack_dec = (fStack_e2c + -0.1151461) * uStack_b70._4_4_;
      fStack_de8 = (fStack_e28 + -0.1151461) * (float)uStack_b68;
      local_e20[0] = 0.116769984;
      local_e20[1] = 0.116769984;
      afStack_e18[0] = 0.116769984;
      afStack_e18[1] = 0.116769984;
      afStack_e10[0] = 0.116769984;
      afStack_e10[1] = 0.116769984;
      afStack_e08[0] = 0.116769984;
      afStack_e08[1] = 0.116769984;
      local_1640._4_4_ = fStack_dfc + 0.116769984;
      local_1640._0_4_ = local_e00 + 0.116769984;
      uStack_1638._0_4_ = fStack_df8 + 0.116769984;
      uStack_1638._4_4_ = fStack_df4 + 0.116769984;
      uStack_1630._0_4_ = fStack_df0 + 0.116769984;
      uStack_1630._4_4_ = fStack_dec + 0.116769984;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_de8 + 0.116769984;
      uStack_1628._4_4_ = fStack_1604 + 0.116769984;
      auVar3 = _local_1640;
      local_1018 = ::_ps256_cephes_log_p3;
      local_fe0 = local_1640;
      uStack_fd8 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_fd0 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_fc8 = uStack_1628;
      local_1000 = local_1540;
      uStack_ff8 = uStack_1538;
      uStack_ff0 = uStack_1530;
      uStack_fe8 = uStack_1528;
      local_dc0 = (local_e00 + 0.116769984) * (float)local_b80;
      fStack_dbc = (fStack_dfc + 0.116769984) * local_b80._4_4_;
      fStack_db8 = (fStack_df8 + 0.116769984) * (float)uStack_b78;
      fStack_db4 = (fStack_df4 + 0.116769984) * uStack_b78._4_4_;
      fStack_db0 = (fStack_df0 + 0.116769984) * (float)uStack_b70;
      fStack_dac = (fStack_dec + 0.116769984) * uStack_b70._4_4_;
      fStack_da8 = (fStack_de8 + 0.116769984) * (float)uStack_b68;
      local_de0[0] = -0.12420141;
      local_de0[1] = -0.12420141;
      afStack_dd8[0] = -0.12420141;
      afStack_dd8[1] = -0.12420141;
      afStack_dd0[0] = -0.12420141;
      afStack_dd0[1] = -0.12420141;
      afStack_dc8[0] = -0.12420141;
      afStack_dc8[1] = -0.12420141;
      local_1640._4_4_ = fStack_dbc + -0.12420141;
      local_1640._0_4_ = local_dc0 + -0.12420141;
      uStack_1638._0_4_ = fStack_db8 + -0.12420141;
      uStack_1638._4_4_ = fStack_db4 + -0.12420141;
      uStack_1630._0_4_ = fStack_db0 + -0.12420141;
      uStack_1630._4_4_ = fStack_dac + -0.12420141;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_da8 + -0.12420141;
      uStack_1628._4_4_ = fStack_1604 + -0.12420141;
      auVar3 = _local_1640;
      local_1078 = ::_ps256_cephes_log_p4;
      local_1040 = local_1640;
      uStack_1038 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_1030 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_1028 = uStack_1628;
      local_1060 = local_1540;
      uStack_1058 = uStack_1538;
      uStack_1050 = uStack_1530;
      uStack_1048 = uStack_1528;
      local_d80 = (local_dc0 + -0.12420141) * (float)local_b80;
      fStack_d7c = (fStack_dbc + -0.12420141) * local_b80._4_4_;
      fStack_d78 = (fStack_db8 + -0.12420141) * (float)uStack_b78;
      fStack_d74 = (fStack_db4 + -0.12420141) * uStack_b78._4_4_;
      fStack_d70 = (fStack_db0 + -0.12420141) * (float)uStack_b70;
      fStack_d6c = (fStack_dac + -0.12420141) * uStack_b70._4_4_;
      fStack_d68 = (fStack_da8 + -0.12420141) * (float)uStack_b68;
      local_da0[0] = 0.14249323;
      local_da0[1] = 0.14249323;
      afStack_d98[0] = 0.14249323;
      afStack_d98[1] = 0.14249323;
      afStack_d90[0] = 0.14249323;
      afStack_d90[1] = 0.14249323;
      afStack_d88[0] = 0.14249323;
      afStack_d88[1] = 0.14249323;
      local_1640._4_4_ = fStack_d7c + 0.14249323;
      local_1640._0_4_ = local_d80 + 0.14249323;
      uStack_1638._0_4_ = fStack_d78 + 0.14249323;
      uStack_1638._4_4_ = fStack_d74 + 0.14249323;
      uStack_1630._0_4_ = fStack_d70 + 0.14249323;
      uStack_1630._4_4_ = fStack_d6c + 0.14249323;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_d68 + 0.14249323;
      uStack_1628._4_4_ = fStack_1604 + 0.14249323;
      auVar3 = _local_1640;
      local_10d8 = ::_ps256_cephes_log_p5;
      local_10a0 = local_1640;
      uStack_1098 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_1090 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_1088 = uStack_1628;
      local_10c0 = local_1540;
      uStack_10b8 = uStack_1538;
      uStack_10b0 = uStack_1530;
      uStack_10a8 = uStack_1528;
      local_d40 = (local_d80 + 0.14249323) * (float)local_b80;
      fStack_d3c = (fStack_d7c + 0.14249323) * local_b80._4_4_;
      fStack_d38 = (fStack_d78 + 0.14249323) * (float)uStack_b78;
      fStack_d34 = (fStack_d74 + 0.14249323) * uStack_b78._4_4_;
      fStack_d30 = (fStack_d70 + 0.14249323) * (float)uStack_b70;
      fStack_d2c = (fStack_d6c + 0.14249323) * uStack_b70._4_4_;
      fStack_d28 = (fStack_d68 + 0.14249323) * (float)uStack_b68;
      local_d60[0] = -0.16668057;
      local_d60[1] = -0.16668057;
      afStack_d58[0] = -0.16668057;
      afStack_d58[1] = -0.16668057;
      afStack_d50[0] = -0.16668057;
      afStack_d50[1] = -0.16668057;
      afStack_d48[0] = -0.16668057;
      afStack_d48[1] = -0.16668057;
      local_1640._4_4_ = fStack_d3c + -0.16668057;
      local_1640._0_4_ = local_d40 + -0.16668057;
      uStack_1638._0_4_ = fStack_d38 + -0.16668057;
      uStack_1638._4_4_ = fStack_d34 + -0.16668057;
      uStack_1630._0_4_ = fStack_d30 + -0.16668057;
      uStack_1630._4_4_ = fStack_d2c + -0.16668057;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_d28 + -0.16668057;
      uStack_1628._4_4_ = fStack_1604 + -0.16668057;
      auVar3 = _local_1640;
      local_1138 = ::_ps256_cephes_log_p6;
      local_1100 = local_1640;
      uStack_10f8 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_10f0 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_10e8 = uStack_1628;
      local_1120 = local_1540;
      uStack_1118 = uStack_1538;
      uStack_1110 = uStack_1530;
      uStack_1108 = uStack_1528;
      local_d00 = (local_d40 + -0.16668057) * (float)local_b80;
      fStack_cfc = (fStack_d3c + -0.16668057) * local_b80._4_4_;
      fStack_cf8 = (fStack_d38 + -0.16668057) * (float)uStack_b78;
      fStack_cf4 = (fStack_d34 + -0.16668057) * uStack_b78._4_4_;
      fStack_cf0 = (fStack_d30 + -0.16668057) * (float)uStack_b70;
      fStack_cec = (fStack_d2c + -0.16668057) * uStack_b70._4_4_;
      fStack_ce8 = (fStack_d28 + -0.16668057) * (float)uStack_b68;
      local_d20[0] = 0.20000714;
      local_d20[1] = 0.20000714;
      afStack_d18[0] = 0.20000714;
      afStack_d18[1] = 0.20000714;
      afStack_d10[0] = 0.20000714;
      afStack_d10[1] = 0.20000714;
      afStack_d08[0] = 0.20000714;
      afStack_d08[1] = 0.20000714;
      local_1640._4_4_ = fStack_cfc + 0.20000714;
      local_1640._0_4_ = local_d00 + 0.20000714;
      uStack_1638._0_4_ = fStack_cf8 + 0.20000714;
      uStack_1638._4_4_ = fStack_cf4 + 0.20000714;
      uStack_1630._0_4_ = fStack_cf0 + 0.20000714;
      uStack_1630._4_4_ = fStack_cec + 0.20000714;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_ce8 + 0.20000714;
      uStack_1628._4_4_ = fStack_1604 + 0.20000714;
      auVar3 = _local_1640;
      local_1198 = ::_ps256_cephes_log_p7;
      local_1160 = local_1640;
      uStack_1158 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_1150 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_1148 = uStack_1628;
      local_1180 = local_1540;
      uStack_1178 = uStack_1538;
      uStack_1170 = uStack_1530;
      uStack_1168 = uStack_1528;
      local_cc0 = (local_d00 + 0.20000714) * (float)local_b80;
      fStack_cbc = (fStack_cfc + 0.20000714) * local_b80._4_4_;
      fStack_cb8 = (fStack_cf8 + 0.20000714) * (float)uStack_b78;
      fStack_cb4 = (fStack_cf4 + 0.20000714) * uStack_b78._4_4_;
      fStack_cb0 = (fStack_cf0 + 0.20000714) * (float)uStack_b70;
      fStack_cac = (fStack_cec + 0.20000714) * uStack_b70._4_4_;
      fStack_ca8 = (fStack_ce8 + 0.20000714) * (float)uStack_b68;
      local_ce0[0] = -0.24999994;
      local_ce0[1] = -0.24999994;
      afStack_cd8[0] = -0.24999994;
      afStack_cd8[1] = -0.24999994;
      afStack_cd0[0] = -0.24999994;
      afStack_cd0[1] = -0.24999994;
      afStack_cc8[0] = -0.24999994;
      afStack_cc8[1] = -0.24999994;
      local_1640._4_4_ = fStack_cbc + -0.24999994;
      local_1640._0_4_ = local_cc0 + -0.24999994;
      uStack_1638._0_4_ = fStack_cb8 + -0.24999994;
      uStack_1638._4_4_ = fStack_cb4 + -0.24999994;
      uStack_1630._0_4_ = fStack_cb0 + -0.24999994;
      uStack_1630._4_4_ = fStack_cac + -0.24999994;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_ca8 + -0.24999994;
      uStack_1628._4_4_ = fStack_1604 + -0.24999994;
      auVar3 = _local_1640;
      local_11f8 = ::_ps256_cephes_log_p8;
      local_11c0 = local_1640;
      uStack_11b8 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_11b0 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_11a8 = uStack_1628;
      local_11e0 = local_1540;
      uStack_11d8 = uStack_1538;
      uStack_11d0 = uStack_1530;
      uStack_11c8 = uStack_1528;
      local_c80 = (local_cc0 + -0.24999994) * (float)local_b80;
      fStack_c7c = (fStack_cbc + -0.24999994) * local_b80._4_4_;
      fStack_c78 = (fStack_cb8 + -0.24999994) * (float)uStack_b78;
      fStack_c74 = (fStack_cb4 + -0.24999994) * uStack_b78._4_4_;
      fStack_c70 = (fStack_cb0 + -0.24999994) * (float)uStack_b70;
      fStack_c6c = (fStack_cac + -0.24999994) * uStack_b70._4_4_;
      fStack_c68 = (fStack_ca8 + -0.24999994) * (float)uStack_b68;
      local_ca0[0] = 0.3333333;
      local_ca0[1] = 0.3333333;
      afStack_c98[0] = 0.3333333;
      afStack_c98[1] = 0.3333333;
      afStack_c90[0] = 0.3333333;
      afStack_c90[1] = 0.3333333;
      afStack_c88[0] = 0.3333333;
      afStack_c88[1] = 0.3333333;
      fVar51 = fStack_1604 + 0.3333333;
      local_1640._4_4_ = fStack_c7c + 0.3333333;
      local_1640._0_4_ = local_c80 + 0.3333333;
      uStack_1638._0_4_ = fStack_c78 + 0.3333333;
      uStack_1638._4_4_ = fStack_c74 + 0.3333333;
      uStack_1630._0_4_ = fStack_c70 + 0.3333333;
      uStack_1630._4_4_ = fStack_c6c + 0.3333333;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_c68 + 0.3333333;
      uStack_1628._4_4_ = fVar51;
      auVar3 = _local_1640;
      local_1360 = local_1640;
      uStack_1358 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_1350 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_1348 = uStack_1628;
      local_1380 = local_1540;
      uStack_1378 = uStack_1538;
      uStack_1370 = uStack_1530;
      uStack_1368 = uStack_1528;
      local_1640._0_4_ = (local_c80 + 0.3333333) * (float)local_b80;
      local_1640._4_4_ = (fStack_c7c + 0.3333333) * local_b80._4_4_;
      fVar46 = (fStack_c78 + 0.3333333) * (float)uStack_b78;
      fVar47 = (fStack_c74 + 0.3333333) * uStack_b78._4_4_;
      fVar48 = (fStack_c70 + 0.3333333) * (float)uStack_b70;
      fVar49 = (fStack_c6c + 0.3333333) * uStack_b70._4_4_;
      fVar50 = (fStack_c68 + 0.3333333) * (float)uStack_b68;
      uStack_1638._0_4_ = fVar46;
      uStack_1638._4_4_ = fVar47;
      uStack_1630._0_4_ = fVar48;
      uStack_1630._4_4_ = fVar49;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fVar50;
      auVar3 = _local_1640;
      local_13a0 = local_1640;
      uStack_1398 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_1390 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_1388 = uStack_1628;
      local_13c0 = CONCAT44(fStack_161c,local_1620);
      uStack_13b8 = CONCAT44(fStack_1614,fStack_1618);
      uStack_13b0 = CONCAT44(fStack_160c,fStack_1610);
      uStack_13a8 = CONCAT44(fStack_1604,fStack_1608);
      local_1640._0_4_ = (float)local_1640._0_4_ * local_1620;
      local_1640._4_4_ = (float)local_1640._4_4_ * fStack_161c;
      fVar46 = fVar46 * fStack_1618;
      fVar47 = fVar47 * fStack_1614;
      fVar48 = fVar48 * fStack_1610;
      fVar49 = fVar49 * fStack_160c;
      fVar50 = fVar50 * fStack_1608;
      uStack_1638._0_4_ = fVar46;
      uStack_1638._4_4_ = fVar47;
      uStack_1630._0_4_ = fVar48;
      uStack_1630._4_4_ = fVar49;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fVar50;
      auVar3 = _local_1640;
      local_12a8 = local_15c0;
      local_1250 = ::_ps256_cephes_log_q1;
      local_1240[0] = -0.00021219444;
      local_1240[1] = -0.00021219444;
      afStack_1238[0] = -0.00021219444;
      afStack_1238[1] = -0.00021219444;
      afStack_1230[0] = -0.00021219444;
      afStack_1230[1] = -0.00021219444;
      afStack_1228[0] = -0.00021219444;
      afStack_1228[1] = -0.00021219444;
      local_1220._0_4_ = local_15c0._0_4_;
      local_1220._4_4_ = local_15c0._4_4_;
      uStack_1218._0_4_ = local_15c0._8_4_;
      uStack_1218._4_4_ = local_15c0._12_4_;
      uStack_1210._0_4_ = local_15c0._16_4_;
      uStack_1210._4_4_ = local_15c0._20_4_;
      uStack_1208._0_4_ = local_15c0._24_4_;
      uStack_c24 = 0xb95e8083;
      local_c40 = (float)local_1220 * -0.00021219444;
      fStack_c3c = local_1220._4_4_ * -0.00021219444;
      fStack_c38 = (float)uStack_1218 * -0.00021219444;
      fStack_c34 = uStack_1218._4_4_ * -0.00021219444;
      fStack_c30 = (float)uStack_1210 * -0.00021219444;
      fStack_c2c = uStack_1210._4_4_ * -0.00021219444;
      fStack_c28 = (float)uStack_1208 * -0.00021219444;
      local_c60 = local_1640;
      uStack_c58 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_c50 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_c48 = uStack_1628;
      local_1640._4_4_ = fStack_c3c + (float)local_1640._4_4_;
      local_1640._0_4_ = local_c40 + (float)local_1640._0_4_;
      uStack_1638._0_4_ = fStack_c38 + fVar46;
      uStack_1638._4_4_ = fStack_c34 + fVar47;
      uStack_1630._0_4_ = fStack_c30 + fVar48;
      uStack_1630._4_4_ = fStack_c2c + fVar49;
      auVar40 = _local_1640;
      uStack_1628._0_4_ = fStack_c28 + fVar50;
      uStack_1628._4_4_ = fVar51 + -0.00021219444;
      auVar3 = _local_1640;
      local_ee8 = &local_1620;
      local_ef0 = ::_ps256_0p5;
      local_ec0 = local_1640;
      uStack_eb8 = uStack_1638;
      uStack_1630 = auVar40._16_8_;
      uStack_eb0 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uStack_ea8 = uStack_1628;
      local_e80 = CONCAT44(fStack_161c,local_1620);
      uStack_e78 = CONCAT44(fStack_1614,fStack_1618);
      uStack_e70 = CONCAT44(fStack_160c,fStack_1610);
      uStack_e68 = CONCAT44(fStack_1604,fStack_1608);
      local_ea0[0] = 0.5;
      local_ea0[1] = 0.5;
      afStack_e98[0] = 0.5;
      afStack_e98[1] = 0.5;
      afStack_e90[0] = 0.5;
      afStack_e90[1] = 0.5;
      afStack_e88[0] = 0.5;
      afStack_e88[1] = 0.5;
      local_ee0 = local_1620 * 0.5;
      fStack_edc = fStack_161c * 0.5;
      fStack_ed8 = fStack_1618 * 0.5;
      fStack_ed4 = fStack_1614 * 0.5;
      fStack_ed0 = fStack_1610 * 0.5;
      fStack_ecc = fStack_160c * 0.5;
      fStack_ec8 = fStack_1608 * 0.5;
      auVar24._4_4_ = fStack_edc;
      auVar24._0_4_ = local_ee0;
      auVar24._8_4_ = fStack_ed8;
      auVar24._12_4_ = fStack_ed4;
      auVar24._16_4_ = fStack_ed0;
      auVar24._20_4_ = fStack_ecc;
      auVar24._24_4_ = fStack_ec8;
      auVar24._28_4_ = fStack_1604;
      auVar3 = vsubps_avx(auVar3,auVar24);
      local_bc0 = local_1540;
      uStack_bb8 = uStack_1538;
      uStack_bb0 = uStack_1530;
      uStack_ba8 = uStack_1528;
      local_1640 = auVar3._0_8_;
      uVar15 = local_1640;
      uStack_1638 = auVar3._8_8_;
      uVar16 = uStack_1638;
      uStack_1630 = auVar3._16_8_;
      uVar17 = uStack_1630;
      uStack_1628 = auVar3._24_8_;
      uVar18 = uStack_1628;
      local_be0._0_4_ = auVar3._0_4_;
      local_be0._4_4_ = auVar3._4_4_;
      uStack_bd8._0_4_ = auVar3._8_4_;
      uStack_bd8._4_4_ = auVar3._12_4_;
      uStack_bd0._0_4_ = auVar3._16_4_;
      uStack_bd0._4_4_ = auVar3._20_4_;
      uStack_bc8._0_4_ = auVar3._24_4_;
      uStack_bc8._4_4_ = auVar3._28_4_;
      local_1540._4_4_ = local_b80._4_4_ + local_be0._4_4_;
      local_1540._0_4_ = (float)local_b80 + (float)local_be0;
      uStack_1538._0_4_ = (float)uStack_b78 + (float)uStack_bd8;
      uStack_1538._4_4_ = uStack_b78._4_4_ + uStack_bd8._4_4_;
      uStack_1530._0_4_ = (float)uStack_b70 + (float)uStack_bd0;
      uStack_1530._4_4_ = uStack_b70._4_4_ + uStack_bd0._4_4_;
      auVar40 = _local_1540;
      uStack_1528._0_4_ = (float)uStack_b68 + (float)uStack_bc8;
      uStack_1528._4_4_ = fStack_1604 + uStack_bc8._4_4_;
      auVar3 = _local_1540;
      local_12b0 = ::_ps256_cephes_log_q2;
      local_1280 = local_15c0;
      uStack_1278 = uStack_15b8;
      uStack_1270 = uStack_15b0;
      uStack_1268 = uStack_15a8;
      local_12a0[0] = 0.6933594;
      local_12a0[1] = 0.6933594;
      afStack_1298[0] = 0.6933594;
      afStack_1298[1] = 0.6933594;
      afStack_1290[0] = 0.6933594;
      afStack_1290[1] = 0.6933594;
      afStack_1288[0] = 0.6933594;
      afStack_1288[1] = 0.6933594;
      uStack_be4 = 0x3f318000;
      local_c00 = (float)local_1220 * 0.6933594;
      fStack_bfc = local_1220._4_4_ * 0.6933594;
      fStack_bf8 = (float)uStack_1218 * 0.6933594;
      fStack_bf4 = uStack_1218._4_4_ * 0.6933594;
      fStack_bf0 = (float)uStack_1210 * 0.6933594;
      fStack_bec = uStack_1210._4_4_ * 0.6933594;
      fStack_be8 = (float)uStack_1208 * 0.6933594;
      local_c20 = local_1540;
      uStack_c18 = uStack_1538;
      uStack_1530 = auVar40._16_8_;
      uStack_c10 = uStack_1530;
      uStack_1528 = auVar3._24_8_;
      uStack_c08 = uStack_1528;
      local_1540._4_4_ = fStack_bfc + local_b80._4_4_ + local_be0._4_4_;
      local_1540._0_4_ = local_c00 + (float)local_b80 + (float)local_be0;
      uStack_1538._0_4_ = fStack_bf8 + (float)uStack_b78 + (float)uStack_bd8;
      uStack_1538._4_4_ = fStack_bf4 + uStack_b78._4_4_ + uStack_bd8._4_4_;
      uStack_1530._0_4_ = fStack_bf0 + (float)uStack_b70 + (float)uStack_bd0;
      uStack_1530._4_4_ = fStack_bec + uStack_b70._4_4_ + uStack_bd0._4_4_;
      auVar40 = _local_1540;
      uStack_1528._0_4_ = fStack_be8 + (float)uStack_b68 + (float)uStack_bc8;
      uStack_1528._4_4_ = fStack_1604 + uStack_bc8._4_4_ + 0.6933594;
      auVar4 = _local_1540;
      local_a20 = local_1540;
      uStack_a18 = uStack_1538;
      uStack_1530 = auVar40._16_8_;
      uStack_a10 = uStack_1530;
      uStack_1528 = auVar4._24_8_;
      uStack_a08 = uStack_1528;
      local_a40 = local_15a0._0_8_;
      uStack_a38 = local_15a0._8_8_;
      uStack_a30 = local_15a0._16_8_;
      uStack_a28 = local_15a0._24_8_;
      auVar25._16_8_ = uStack_1530;
      auVar25._0_16_ = _local_1540;
      auVar25._24_8_ = uStack_1528;
      _local_1660 = vorps_avx(auVar25,local_15a0);
      local_804 = 0x3ede5bd9;
      local_7d0 = 0x3ede5bd9;
      auVar1 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3ede5bd9),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3ede5bd9),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3ede5bd9),ZEXT416(0x3ede5bd9),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3ede5bd9),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3ede5bd9),0x30);
      auVar45._16_16_ = auVar1;
      auVar45._0_16_ = auVar2;
      local_800._0_8_ = auVar2._0_8_;
      local_800._8_8_ = auVar2._8_8_;
      local_800._16_8_ = auVar1._0_8_;
      local_800._24_8_ = auVar1._8_8_;
      local_1680._0_4_ = auVar2._0_4_;
      local_1680._4_4_ = auVar2._4_4_;
      uStack_1678._0_4_ = auVar2._8_4_;
      uStack_1678._4_4_ = auVar2._12_4_;
      uStack_1670._0_4_ = auVar1._0_4_;
      uStack_1670._4_4_ = auVar1._4_4_;
      uStack_1668._0_4_ = auVar1._8_4_;
      local_1840._4_4_ = (float)local_1660._4_4_ * local_1680._4_4_;
      uStack_1838._4_4_ = fStack_1654 * uStack_1678._4_4_;
      uStack_1830._4_4_ = fStack_164c * uStack_1670._4_4_;
      local_1840 = CONCAT44(local_1840._4_4_,(float)local_1660._0_4_ * (float)local_1680);
      uStack_1838 = CONCAT44(uStack_1838._4_4_,fStack_1658 * (float)uStack_1678);
      uStack_1830 = CONCAT44(uStack_1830._4_4_,fStack_1650 * (float)uStack_1670);
      uStack_1748 = CONCAT44(uStack_1644,fStack_1648 * (float)uStack_1668);
      uStack_1828._4_4_ = uStack_1644;
      local_1730 = local_17d0;
      auVar3._8_8_ = uStack_1838;
      auVar3._0_8_ = local_1840;
      auVar3._16_8_ = uStack_1830;
      auVar3._24_8_ = uStack_1748;
      *local_17d0 = auVar3;
      local_17d0 = local_17d0 + 1;
      uVar6 = uStack_1748;
      local_1760 = local_1840;
      uStack_1758 = uStack_1838;
      uStack_1750 = uStack_1830;
      local_1680 = local_800._0_8_;
      uStack_1678 = local_800._8_8_;
      uStack_1670 = local_800._16_8_;
      uStack_1668 = local_800._24_8_;
      _local_1640 = _local_1660;
      _local_1540 = auVar4;
      local_1320 = local_1340;
      uStack_1318 = uStack_1338;
      uStack_1310 = uStack_1330;
      uStack_1308 = uStack_1328;
      local_1248 = local_12a8;
      local_1220 = local_15c0;
      uStack_1218 = uStack_15b8;
      uStack_1210 = uStack_15b0;
      uStack_1208 = uStack_15a8;
      local_11f0 = local_12b8;
      local_11e8 = local_1258;
      local_1190 = local_12b8;
      local_1188 = local_1258;
      local_1130 = local_12b8;
      local_1128 = local_1258;
      local_10d0 = local_12b8;
      local_10c8 = local_1258;
      local_1070 = local_12b8;
      local_1068 = local_1258;
      local_1010 = local_12b8;
      local_1008 = local_1258;
      local_fb0 = local_12b8;
      local_fa8 = local_1258;
      local_f50 = local_12b8;
      local_f48 = local_1258;
      local_ef8 = local_1258;
      fStack_ec4 = fStack_1604;
      fStack_e24 = fStack_1604;
      fStack_de4 = fStack_1604;
      fStack_da4 = fStack_1604;
      fStack_d64 = fStack_1604;
      fStack_d24 = fStack_1604;
      fStack_ce4 = fStack_1604;
      fStack_ca4 = fStack_1604;
      fStack_c64 = fStack_1604;
      local_be0 = uVar15;
      uStack_bd8 = uVar16;
      uStack_bd0 = uVar17;
      uStack_bc8 = uVar18;
      local_ba0 = local_1600._0_8_;
      uStack_b98 = local_1600._8_8_;
      uStack_b90 = local_1600._16_8_;
      uStack_b88 = local_1600._24_8_;
      local_b80 = uVar11;
      uStack_b78 = uVar12;
      uStack_b70 = uVar13;
      uStack_b68 = uVar14;
      local_b40 = uVar7;
      uStack_b38 = uVar8;
      uStack_b30 = uVar9;
      uStack_b28 = uVar10;
      local_800 = auVar45;
      local_7cc = local_7d0;
      local_7c8 = local_7d0;
      local_7c4 = local_7d0;
      local_7c0 = local_7d0;
      local_7bc = local_7d0;
      local_7b8 = local_7d0;
      local_7b4 = local_7d0;
    }
    for (; fVar50 = uStack_1848._4_4_, fVar49 = local_1850._4_4_, uVar6 = local_1850,
        uVar7 = uStack_1848, uVar8 = local_1840, uVar9 = uStack_1838, uVar10 = uStack_1830,
        uVar11 = uStack_1828, local_16b8 = local_1770, local_1850._4_4_ = fVar49,
        uStack_1848._4_4_ = fVar50, local_17f8 = local_1708, local_181c + 3 < local_17c4;
        local_181c = local_181c + 4) {
      local_1728 = local_17d0;
      local_5d0 = *(undefined8 *)*local_17d0;
      uStack_5c8 = *(undefined8 *)(*local_17d0 + 8);
      uStack_1848._4_4_ = (float)((ulong)uStack_5c8 >> 0x20);
      local_7a8 = local_17a9;
      local_7b0 = &local_1850;
      auVar39._12_4_ = uStack_1848._4_4_;
      auVar39._0_12_ = *(undefined1 (*) [12])*local_17d0;
      auVar38._12_4_ = uStack_1848._4_4_;
      auVar38._0_12_ = *(undefined1 (*) [12])*local_17d0;
      local_720 = 0x3f8000003f800000;
      uStack_718 = 0x3f8000003f800000;
      local_f0 = 0;
      local_650._8_8_ = SUB168(ZEXT816(0),4);
      uStack_e8 = local_650._8_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_650._8_8_;
      local_730 = vcmpps_avx(auVar39,auVar43 << 0x40,2);
      local_5e0 = 0x80000000800000;
      uStack_5d8 = 0x80000000800000;
      auVar32._8_8_ = 0x80000000800000;
      auVar32._0_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(auVar38,auVar32);
      local_700 = auVar1._0_8_;
      local_d0 = local_700;
      uStack_6f8 = auVar1._8_8_;
      uStack_c8 = uStack_6f8;
      local_120 = local_700;
      uStack_118 = uStack_6f8;
      local_124 = 0x17;
      auVar5 = vpsrld_avx(auVar1,ZEXT416(0x17));
      local_6a0 = local_700;
      uStack_698 = uStack_6f8;
      local_6b0 = 0x807fffff807fffff;
      uStack_6a8 = 0x807fffff807fffff;
      auVar29._8_8_ = 0x807fffff807fffff;
      auVar29._0_8_ = 0x807fffff807fffff;
      auVar1 = vpand_avx(auVar1,auVar29);
      local_700 = auVar1._0_8_;
      local_90 = local_700;
      uStack_6f8 = auVar1._8_8_;
      uStack_88 = uStack_6f8;
      local_a0 = 0x3f0000003f000000;
      uStack_98 = 0x3f0000003f000000;
      auVar36._8_8_ = 0x3f0000003f000000;
      auVar36._0_8_ = 0x3f0000003f000000;
      auVar2 = vpor_avx(auVar1,auVar36);
      local_710._0_8_ = auVar5._0_8_;
      local_100 = local_710._0_8_;
      local_710._8_8_ = auVar5._8_8_;
      uStack_f8 = local_710._8_8_;
      local_110 = 0x7f0000007f;
      uStack_108 = 0x7f0000007f;
      auVar34._8_8_ = 0x7f0000007f;
      auVar34._0_8_ = 0x7f0000007f;
      local_710 = vpsubd_avx(auVar5,auVar34);
      local_560 = local_710._0_8_;
      uStack_558 = local_710._8_8_;
      auVar1 = vcvtdq2ps_avx(local_710);
      local_740 = auVar1._0_8_;
      uVar6 = local_740;
      uStack_738 = auVar1._8_8_;
      uVar7 = uStack_738;
      local_580 = 0x3f8000003f800000;
      uStack_578 = 0x3f8000003f800000;
      local_570._0_4_ = auVar1._0_4_;
      local_570._4_4_ = auVar1._4_4_;
      uStack_568._0_4_ = auVar1._8_4_;
      uStack_568._4_4_ = auVar1._12_4_;
      local_740._4_4_ = local_570._4_4_ + 1.0;
      local_740._0_4_ = (float)local_570 + 1.0;
      uStack_738._0_4_ = (float)uStack_568 + 1.0;
      uStack_738._4_4_ = uStack_568._4_4_ + 1.0;
      local_700 = auVar2._0_8_;
      local_70 = local_700;
      uStack_6f8 = auVar2._8_8_;
      uStack_68 = uStack_6f8;
      local_80 = 0x3f3504f33f3504f3;
      uStack_78 = 0x3f3504f33f3504f3;
      auVar37._8_8_ = 0x3f3504f33f3504f3;
      auVar37._0_8_ = 0x3f3504f33f3504f3;
      local_750 = vcmpps_avx(auVar2,auVar37,1);
      local_6c0 = local_700;
      uStack_6b8 = uStack_6f8;
      local_6d0 = local_750._0_8_;
      uStack_6c8 = local_750._8_8_;
      local_760 = vpand_avx(auVar2,local_750);
      local_660 = local_700;
      uStack_658 = uStack_6f8;
      local_670 = 0x3f8000003f800000;
      uStack_668 = 0x3f8000003f800000;
      auVar31._8_8_ = 0x3f8000003f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar2,auVar31);
      local_680 = local_740;
      uStack_678 = uStack_738;
      local_6e0 = 0x3f8000003f800000;
      uStack_6d8 = 0x3f8000003f800000;
      local_6f0 = local_750._0_8_;
      uStack_6e8 = local_750._8_8_;
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      local_690 = vpand_avx(auVar28,local_750);
      auVar30._8_8_ = uStack_738;
      auVar30._0_8_ = local_740;
      _local_740 = vsubps_avx(auVar30,local_690);
      local_700 = auVar1._0_8_;
      uVar8 = local_700;
      uStack_6f8 = auVar1._8_8_;
      uVar9 = uStack_6f8;
      local_590._0_4_ = auVar1._0_4_;
      local_590._4_4_ = auVar1._4_4_;
      uStack_588._0_4_ = auVar1._8_4_;
      uStack_588._4_4_ = auVar1._12_4_;
      local_5a0._0_4_ = local_760._0_4_;
      local_5a0._4_4_ = local_760._4_4_;
      uStack_598._0_4_ = local_760._8_4_;
      uStack_598._4_4_ = local_760._12_4_;
      local_590._0_4_ = (float)local_590 + (float)local_5a0;
      local_590._4_4_ = local_590._4_4_ + local_5a0._4_4_;
      uStack_588._0_4_ = (float)uStack_588 + (float)uStack_598;
      uStack_588._4_4_ = uStack_588._4_4_ + uStack_598._4_4_;
      local_700._4_4_ = local_590._4_4_;
      local_700._0_4_ = (float)local_590;
      uStack_6f8._0_4_ = (float)uStack_588;
      uStack_6f8._4_4_ = uStack_588._4_4_;
      local_600 = local_700;
      uStack_5f8 = uStack_6f8;
      local_770 = (float)local_590 * (float)local_590;
      fStack_76c = local_590._4_4_ * local_590._4_4_;
      fStack_768 = (float)uStack_588 * (float)uStack_588;
      fStack_764 = uStack_588._4_4_ * uStack_588._4_4_;
      local_548 = local_780;
      local_4e8 = local_700;
      local_188 = ::_ps_cephes_log_p1;
      local_160 = 0x3d9021bb3d9021bb;
      uStack_158 = 0x3d9021bb3d9021bb;
      local_170 = local_700;
      uStack_168 = uStack_6f8;
      local_140 = (float)local_590 * 0.070376836;
      fStack_13c = local_590._4_4_ * 0.070376836;
      fStack_138 = (float)uStack_588 * 0.070376836;
      fStack_134 = uStack_588._4_4_ * 0.070376836;
      local_150[0] = -0.1151461;
      local_150[1] = -0.1151461;
      afStack_148[0] = -0.1151461;
      afStack_148[1] = -0.1151461;
      local_780._4_4_ = fStack_13c + -0.1151461;
      local_780._0_4_ = local_140 + -0.1151461;
      uStack_778._0_4_ = fStack_138 + -0.1151461;
      uStack_778._4_4_ = fStack_134 + -0.1151461;
      local_1e8 = ::_ps_cephes_log_p2;
      local_1c0 = local_780;
      uStack_1b8 = uStack_778;
      local_1d0 = local_700;
      uStack_1c8 = uStack_6f8;
      local_1a0 = (local_140 + -0.1151461) * (float)local_590;
      fStack_19c = (fStack_13c + -0.1151461) * local_590._4_4_;
      fStack_198 = (fStack_138 + -0.1151461) * (float)uStack_588;
      fStack_194 = (fStack_134 + -0.1151461) * uStack_588._4_4_;
      local_1b0[0] = 0.116769984;
      local_1b0[1] = 0.116769984;
      afStack_1a8[0] = 0.116769984;
      afStack_1a8[1] = 0.116769984;
      local_780._4_4_ = fStack_19c + 0.116769984;
      local_780._0_4_ = local_1a0 + 0.116769984;
      uStack_778._0_4_ = fStack_198 + 0.116769984;
      uStack_778._4_4_ = fStack_194 + 0.116769984;
      local_248 = ::_ps_cephes_log_p3;
      local_220 = local_780;
      uStack_218 = uStack_778;
      local_230 = local_700;
      uStack_228 = uStack_6f8;
      local_200 = (local_1a0 + 0.116769984) * (float)local_590;
      fStack_1fc = (fStack_19c + 0.116769984) * local_590._4_4_;
      fStack_1f8 = (fStack_198 + 0.116769984) * (float)uStack_588;
      fStack_1f4 = (fStack_194 + 0.116769984) * uStack_588._4_4_;
      local_210[0] = -0.12420141;
      local_210[1] = -0.12420141;
      afStack_208[0] = -0.12420141;
      afStack_208[1] = -0.12420141;
      local_780._4_4_ = fStack_1fc + -0.12420141;
      local_780._0_4_ = local_200 + -0.12420141;
      uStack_778._0_4_ = fStack_1f8 + -0.12420141;
      uStack_778._4_4_ = fStack_1f4 + -0.12420141;
      local_2a8 = ::_ps_cephes_log_p4;
      local_280 = local_780;
      uStack_278 = uStack_778;
      local_290 = local_700;
      uStack_288 = uStack_6f8;
      local_260 = (local_200 + -0.12420141) * (float)local_590;
      fStack_25c = (fStack_1fc + -0.12420141) * local_590._4_4_;
      fStack_258 = (fStack_1f8 + -0.12420141) * (float)uStack_588;
      fStack_254 = (fStack_1f4 + -0.12420141) * uStack_588._4_4_;
      local_270[0] = 0.14249323;
      local_270[1] = 0.14249323;
      afStack_268[0] = 0.14249323;
      afStack_268[1] = 0.14249323;
      local_780._4_4_ = fStack_25c + 0.14249323;
      local_780._0_4_ = local_260 + 0.14249323;
      uStack_778._0_4_ = fStack_258 + 0.14249323;
      uStack_778._4_4_ = fStack_254 + 0.14249323;
      local_308 = ::_ps_cephes_log_p5;
      local_2e0 = local_780;
      uStack_2d8 = uStack_778;
      local_2f0 = local_700;
      uStack_2e8 = uStack_6f8;
      local_2c0 = (local_260 + 0.14249323) * (float)local_590;
      fStack_2bc = (fStack_25c + 0.14249323) * local_590._4_4_;
      fStack_2b8 = (fStack_258 + 0.14249323) * (float)uStack_588;
      fStack_2b4 = (fStack_254 + 0.14249323) * uStack_588._4_4_;
      local_2d0[0] = -0.16668057;
      local_2d0[1] = -0.16668057;
      afStack_2c8[0] = -0.16668057;
      afStack_2c8[1] = -0.16668057;
      local_780._4_4_ = fStack_2bc + -0.16668057;
      local_780._0_4_ = local_2c0 + -0.16668057;
      uStack_778._0_4_ = fStack_2b8 + -0.16668057;
      uStack_778._4_4_ = fStack_2b4 + -0.16668057;
      local_368 = ::_ps_cephes_log_p6;
      local_340 = local_780;
      uStack_338 = uStack_778;
      local_350 = local_700;
      uStack_348 = uStack_6f8;
      local_320 = (local_2c0 + -0.16668057) * (float)local_590;
      fStack_31c = (fStack_2bc + -0.16668057) * local_590._4_4_;
      fStack_318 = (fStack_2b8 + -0.16668057) * (float)uStack_588;
      fStack_314 = (fStack_2b4 + -0.16668057) * uStack_588._4_4_;
      local_330[0] = 0.20000714;
      local_330[1] = 0.20000714;
      afStack_328[0] = 0.20000714;
      afStack_328[1] = 0.20000714;
      local_780._4_4_ = fStack_31c + 0.20000714;
      local_780._0_4_ = local_320 + 0.20000714;
      uStack_778._0_4_ = fStack_318 + 0.20000714;
      uStack_778._4_4_ = fStack_314 + 0.20000714;
      local_3c8 = ::_ps_cephes_log_p7;
      local_3a0 = local_780;
      uStack_398 = uStack_778;
      local_3b0 = local_700;
      uStack_3a8 = uStack_6f8;
      local_380 = (local_320 + 0.20000714) * (float)local_590;
      fStack_37c = (fStack_31c + 0.20000714) * local_590._4_4_;
      fStack_378 = (fStack_318 + 0.20000714) * (float)uStack_588;
      fStack_374 = (fStack_314 + 0.20000714) * uStack_588._4_4_;
      local_390[0] = -0.24999994;
      local_390[1] = -0.24999994;
      afStack_388[0] = -0.24999994;
      afStack_388[1] = -0.24999994;
      local_780._4_4_ = fStack_37c + -0.24999994;
      local_780._0_4_ = local_380 + -0.24999994;
      uStack_778._0_4_ = fStack_378 + -0.24999994;
      uStack_778._4_4_ = fStack_374 + -0.24999994;
      local_428 = ::_ps_cephes_log_p8;
      local_400 = local_780;
      uStack_3f8 = uStack_778;
      local_410 = local_700;
      uStack_408 = uStack_6f8;
      local_3e0 = (local_380 + -0.24999994) * (float)local_590;
      fStack_3dc = (fStack_37c + -0.24999994) * local_590._4_4_;
      fStack_3d8 = (fStack_378 + -0.24999994) * (float)uStack_588;
      fStack_3d4 = (fStack_374 + -0.24999994) * uStack_588._4_4_;
      local_3f0[0] = 0.3333333;
      local_3f0[1] = 0.3333333;
      afStack_3e8[0] = 0.3333333;
      afStack_3e8[1] = 0.3333333;
      local_780._4_4_ = fStack_3dc + 0.3333333;
      local_780._0_4_ = local_3e0 + 0.3333333;
      uStack_778._0_4_ = fStack_3d8 + 0.3333333;
      uStack_778._4_4_ = fStack_3d4 + 0.3333333;
      local_610 = local_780;
      uStack_608 = uStack_778;
      local_620 = local_700;
      uStack_618 = uStack_6f8;
      local_780._0_4_ = (local_3e0 + 0.3333333) * (float)local_590;
      local_780._4_4_ = (fStack_3dc + 0.3333333) * local_590._4_4_;
      fVar49 = (fStack_3d8 + 0.3333333) * (float)uStack_588;
      fVar50 = (fStack_3d4 + 0.3333333) * uStack_588._4_4_;
      uStack_778._0_4_ = fVar49;
      uStack_778._4_4_ = fVar50;
      local_630 = local_780;
      uStack_628 = uStack_778;
      local_640 = CONCAT44(fStack_76c,local_770);
      uStack_638 = CONCAT44(fStack_764,fStack_768);
      local_780._0_4_ = (float)local_780._0_4_ * local_770;
      local_780._4_4_ = (float)local_780._4_4_ * fStack_76c;
      fVar49 = fVar49 * fStack_768;
      fVar50 = fVar50 * fStack_764;
      uStack_778._0_4_ = fVar49;
      uStack_778._4_4_ = fVar50;
      local_4d8 = local_740;
      local_480 = ::_ps_cephes_log_q1;
      local_470[0] = -0.00021219444;
      local_470[1] = -0.00021219444;
      afStack_468[0] = -0.00021219444;
      afStack_468[1] = -0.00021219444;
      local_460._0_4_ = local_740._0_4_;
      local_460._4_4_ = local_740._4_4_;
      uStack_458._0_4_ = local_740._8_4_;
      uStack_458._4_4_ = local_740._12_4_;
      local_440 = (float)local_460 * -0.00021219444;
      fStack_43c = local_460._4_4_ * -0.00021219444;
      fStack_438 = (float)uStack_458 * -0.00021219444;
      fStack_434 = uStack_458._4_4_ * -0.00021219444;
      local_450 = local_780;
      uStack_448 = uStack_778;
      local_780._4_4_ = fStack_43c + (float)local_780._4_4_;
      local_780._0_4_ = local_440 + (float)local_780._0_4_;
      uStack_778._0_4_ = fStack_438 + fVar49;
      uStack_778._4_4_ = fStack_434 + fVar50;
      local_538 = &local_770;
      local_540 = ::_ps_0p5;
      local_520 = local_780;
      uStack_518 = uStack_778;
      local_500 = CONCAT44(fStack_76c,local_770);
      uStack_4f8 = CONCAT44(fStack_764,fStack_768);
      local_510[0] = 0.5;
      local_510[1] = 0.5;
      afStack_508[0] = 0.5;
      afStack_508[1] = 0.5;
      local_530 = local_770 * 0.5;
      fStack_52c = fStack_76c * 0.5;
      fStack_528 = fStack_768 * 0.5;
      fStack_524 = fStack_764 * 0.5;
      auVar33._4_4_ = fStack_52c;
      auVar33._0_4_ = local_530;
      auVar33._8_4_ = fStack_528;
      auVar33._12_4_ = fStack_524;
      _local_780 = vsubps_avx(_local_780,auVar33);
      local_5b0 = local_700;
      uStack_5a8 = uStack_6f8;
      local_5c0._0_4_ = local_780._0_4_;
      local_5c0._4_4_ = local_780._4_4_;
      uStack_5b8._0_4_ = local_780._8_4_;
      uStack_5b8._4_4_ = local_780._12_4_;
      local_700._4_4_ = local_590._4_4_ + local_5c0._4_4_;
      local_700._0_4_ = (float)local_590 + (float)local_5c0;
      uStack_6f8._0_4_ = (float)uStack_588 + (float)uStack_5b8;
      uStack_6f8._4_4_ = uStack_588._4_4_ + uStack_5b8._4_4_;
      local_4e0 = ::_ps_cephes_log_q2;
      local_4c0 = local_740;
      uStack_4b8 = uStack_738;
      local_4d0[0] = 0.6933594;
      local_4d0[1] = 0.6933594;
      afStack_4c8[0] = 0.6933594;
      afStack_4c8[1] = 0.6933594;
      local_4a0 = (float)local_460 * 0.6933594;
      fStack_49c = local_460._4_4_ * 0.6933594;
      fStack_498 = (float)uStack_458 * 0.6933594;
      fStack_494 = uStack_458._4_4_ * 0.6933594;
      local_4b0 = local_700;
      uStack_4a8 = uStack_6f8;
      local_700._4_4_ = fStack_49c + local_590._4_4_ + local_5c0._4_4_;
      local_700._0_4_ = local_4a0 + (float)local_590 + (float)local_5c0;
      uStack_6f8._0_4_ = fStack_498 + (float)uStack_588 + (float)uStack_5b8;
      uStack_6f8._4_4_ = fStack_494 + uStack_588._4_4_ + uStack_5b8._4_4_;
      local_b0 = local_700;
      uStack_a8 = uStack_6f8;
      local_c0 = local_730._0_8_;
      uStack_b8 = local_730._8_8_;
      auVar35._8_8_ = uStack_6f8;
      auVar35._0_8_ = local_700;
      _local_790 = vpor_avx(auVar35,local_730);
      local_44 = 0x3ede5bd9;
      local_60 = 0x3ede5bd9;
      local_7a0 = 0x3ede5bd93ede5bd9;
      uStack_798 = 0x3ede5bd93ede5bd9;
      local_1850._4_4_ = (float)local_790._4_4_ * 0.4342945;
      uStack_1848._4_4_ = fStack_784 * 0.4342945;
      local_1850 = CONCAT44(local_1850._4_4_,(float)local_790._0_4_ * 0.4342945);
      uStack_1848 = CONCAT44(uStack_1848._4_4_,fStack_788 * 0.4342945);
      local_1710 = local_17d0;
      auVar19._8_8_ = uStack_1848;
      auVar19._0_8_ = local_1850;
      *(undefined1 (*) [16])*local_17d0 = auVar19;
      local_17d0 = (undefined1 (*) [32])(*local_17d0 + 0x10);
      local_1720 = local_1850;
      uStack_1718 = uStack_1848;
      _local_700 = _local_790;
      local_650 = ZEXT816(0) << 0x20;
      local_5f0 = local_600;
      uStack_5e8 = uStack_5f8;
      local_5c0 = local_780;
      uStack_5b8 = uStack_778;
      local_5a0 = local_760._0_8_;
      uStack_598 = local_760._8_8_;
      local_590 = uVar8;
      uStack_588 = uVar9;
      local_570 = uVar6;
      uStack_568 = uVar7;
      local_488 = local_548;
      local_478 = local_4d8;
      local_460 = local_740;
      uStack_458 = uStack_738;
      local_420 = local_4e8;
      local_418 = local_548;
      local_3c0 = local_4e8;
      local_3b8 = local_548;
      local_360 = local_4e8;
      local_358 = local_548;
      local_300 = local_4e8;
      local_2f8 = local_548;
      local_2a0 = local_4e8;
      local_298 = local_548;
      local_240 = local_4e8;
      local_238 = local_548;
      local_1e0 = local_4e8;
      local_1d8 = local_548;
      local_180 = local_4e8;
      local_178 = local_548;
      local_e0 = local_5d0;
      uStack_d8 = uStack_5c8;
      uStack_5c = local_60;
      uStack_58 = local_60;
      uStack_54 = local_60;
    }
    for (; uStack_1828._4_4_ = uVar44, uStack_1830._4_4_ = fVar48, uStack_1838._4_4_ = fVar47,
        local_1840._4_4_ = fVar46, uStack_1828 = uVar11, uStack_1830 = uVar10, uStack_1838 = uVar9,
        local_1840 = uVar8, uStack_1848 = uVar7, local_1850 = uVar6, uVar44 = uStack_1828._4_4_,
        fVar50 = uStack_1830._4_4_, fVar49 = uStack_1838._4_4_, fVar48 = local_1840._4_4_,
        fVar47 = uStack_1848._4_4_, fVar46 = local_1850._4_4_, local_181c < local_17c4;
        local_181c = local_181c + 1) {
      local_38 = local_17a9;
      local_40 = local_17d0;
      uVar6 = local_1850;
      local_1850._4_4_ = fVar46;
      uVar7 = uStack_1848;
      uStack_1848._4_4_ = fVar47;
      uVar8 = local_1840;
      local_1840._4_4_ = fVar48;
      uVar9 = uStack_1838;
      uStack_1838._4_4_ = fVar49;
      uVar10 = uStack_1830;
      uStack_1830._4_4_ = fVar50;
      uVar11 = uStack_1828;
      uStack_1828._4_4_ = uVar44;
      fVar46 = log10f(*(float *)*local_17d0);
      uVar11 = uStack_1828;
      uVar10 = uStack_1830;
      uVar9 = uStack_1838;
      uVar8 = local_1840;
      uVar7 = uStack_1848;
      uVar6 = local_1850;
      *(float *)*local_17d0 = fVar46;
      local_17d0 = (undefined1 (*) [32])(*local_17d0 + 4);
      fVar46 = local_1840._4_4_;
      fVar47 = uStack_1838._4_4_;
      fVar48 = uStack_1830._4_4_;
      uVar44 = uStack_1828._4_4_;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}